

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkTryNewMiter(char *pFileName0,char *pFileName1)

{
  Cnf_Dat_t *p;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk_01;
  Gia_Man_t *pGia;
  int *pVars;
  ulong uVar2;
  sat_solver *s;
  int *piVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int Lit;
  int local_58;
  uint local_54;
  Vec_Ptr_t *local_50;
  Cnf_Dat_t *local_48;
  void **local_40;
  long local_38;
  
  pNtk = Io_Read(pFileName0,IO_FILE_VERILOG,1,0);
  pNtk_00 = Io_Read(pFileName1,IO_FILE_VERILOG,1,0);
  pNtk1 = Abc_NtkStrash(pNtk,1,1,0);
  pNtk2 = Abc_NtkStrash(pNtk_00,1,1,0);
  pNtk_01 = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,1);
  pGia = Abc_NtkClpGia(pNtk_01);
  if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c1,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c2,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  Abc_NtkDelete(pNtk);
  Abc_NtkDelete(pNtk_00);
  Abc_NtkDelete(pNtk1);
  Abc_NtkDelete(pNtk2);
  Abc_NtkDelete(pNtk_01);
  lVar6 = (long)pGia->vCos->nSize - (long)pGia->nRegs;
  local_50 = Vec_PtrAlloc((int)lVar6);
  local_50->nSize = (int)lVar6;
  local_40 = local_50->pArray;
  uVar7 = 0;
  local_38 = lVar6;
  memset(local_40,0,lVar6 * 8);
  local_48 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  local_58 = pGia->vCis->nSize;
  iVar5 = pGia->nRegs;
  uVar4 = local_58 - iVar5;
  iVar1 = local_48->nVars;
  pVars = (int *)malloc((long)(int)uVar4 * 4);
  p = local_48;
  uVar2 = 0;
  if (0 < (int)uVar4) {
    uVar2 = (ulong)uVar4;
  }
  for (; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    pVars[uVar7] = ((iVar5 + iVar1) - local_58) + (int)uVar7;
  }
  local_54 = uVar4;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_48,1,0);
  Cnf_DataFree(p);
  iVar5 = 2;
  uVar2 = 0;
  do {
    if ((long)pGia->vCos->nSize - (long)pGia->nRegs <= (long)uVar2) {
      Gia_ManStop(pGia);
      sat_solver_delete(s);
      free(pVars);
      return local_50;
    }
    Lit = iVar5;
    iVar1 = sat_solver_solve(s,&Lit,&local_58,100000,0,0,0);
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        __assert_fail("status != l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                      ,0x4d5,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
      }
      piVar3 = Sat_SolverGetModel(s,pVars,local_54);
      if (local_38 <= (long)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      local_40[uVar2] = piVar3;
      printf("Output %3d (out of %3d) is SAT.\n",uVar2 & 0xffffffff,
             (ulong)(uint)(pGia->vCos->nSize - pGia->nRegs));
    }
    iVar5 = iVar5 + 2;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NtkTryNewMiter( char * pFileName0, char * pFileName1 )
{
    extern void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit );
    int i, nVars, * pVars, iCiVarBeg, iCoVarBeg = 1, nBTLimit = 100000;
    sat_solver * pSat  = NULL;
    Cnf_Dat_t * pCnf   = NULL;
    Vec_Ptr_t * vCexes = NULL;
    Abc_Ntk_t * pNtk1  = Io_Read( pFileName0, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk2  = Io_Read( pFileName1, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk1_ = Abc_NtkStrash( pNtk1, 1, 1, 0 );
    Abc_Ntk_t * pNtk2_ = Abc_NtkStrash( pNtk2, 1, 1, 0 );
    Abc_Ntk_t * pMiter = Abc_NtkMiter( pNtk1_, pNtk2_, 1, 0, 0, 1 );
    Gia_Man_t * pGia = Abc_NtkClpGia( pMiter );
    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    Abc_NtkDelete( pNtk1 );
    Abc_NtkDelete( pNtk2 );
    Abc_NtkDelete( pNtk1_ );
    Abc_NtkDelete( pNtk2_ );
    Abc_NtkDelete( pMiter );
    vCexes = Vec_PtrStart( Gia_ManPoNum(pGia) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 0, 0, 0 );
    nVars = Gia_ManPiNum(pGia);
    iCiVarBeg = pCnf->nVars - nVars;
    pVars = ABC_ALLOC( int, nVars );
    for ( i = 0; i < nVars; i++ )
        pVars[i] = iCiVarBeg + i;
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    Cnf_DataFree( pCnf );
    for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
    {
        int Lit = Abc_Var2Lit( iCoVarBeg + i, 0 );
        int status = sat_solver_solve( pSat, &Lit, &Lit + 1, nBTLimit, 0, 0, 0 );
        assert( status != l_Undef );
        if ( status == l_False )
            continue;
        Vec_PtrWriteEntry( vCexes, i, Sat_SolverGetModel(pSat, pVars, nVars) );
        printf( "Output %3d (out of %3d) is SAT.\n", i, Gia_ManPoNum(pGia) );
    }
    Gia_ManStop( pGia );
    sat_solver_delete( pSat );
    ABC_FREE( pVars );
    return vCexes;
}